

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O1

int __thiscall
QCommandLinkButtonPrivate::descriptionHeight(QCommandLinkButtonPrivate *this,int widgetWidth)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  long extraout_RDX;
  long in_FS_OFFSET;
  undefined4 uVar4;
  QTextLayout layout;
  double local_70;
  QTextLayout local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = textOffset(this);
  if ((this->description).d.size == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    local_50.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::QTextLayout(&local_50,(QString *)&this->description);
    descriptionFont((QCommandLinkButtonPrivate *)&local_48);
    QTextLayout::setFont((QFont *)&local_50);
    QFont::~QFont((QFont *)&local_48);
    QTextLayout::beginLayout();
    local_70 = 0.0;
    while( true ) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      uVar3 = QTextLayout::createLine();
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,uVar3);
      puStack_40 = (undefined1 *)extraout_RDX;
      if (extraout_RDX == 0) break;
      QTextLine::setLineWidth((double)((widgetWidth - iVar2) + -4));
      QTextLine::setPosition((QPointF *)&local_48);
      dVar1 = (double)QTextLine::height();
      local_70 = local_70 + dVar1;
    }
    QTextLayout::endLayout();
    QTextLayout::~QTextLayout(&local_50);
    uVar3 = SUB84(local_70,0);
    uVar4 = (undefined4)((ulong)local_70 >> 0x20);
  }
  dVar1 = ceil((double)CONCAT44(uVar4,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (int)dVar1;
}

Assistant:

int QCommandLinkButtonPrivate::descriptionHeight(int widgetWidth) const
{
    // Calc width of actual paragraph
    int lineWidth = widgetWidth - textOffset() - rightMargin();

    qreal descriptionheight = 0;
    if (!description.isEmpty()) {
        QTextLayout layout(description);
        layout.setFont(descriptionFont());
        layout.beginLayout();
        while (true) {
            QTextLine line = layout.createLine();
            if (!line.isValid())
                break;
            line.setLineWidth(lineWidth);
            line.setPosition(QPointF(0, descriptionheight));
            descriptionheight += line.height();
        }
        layout.endLayout();
    }
    return qCeil(descriptionheight);
}